

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O2

int NULLCTypeInfo::IsPointerRef(NULLCRef r)

{
  ExternTypeInfo *pEVar1;
  uint in_stack_00000008;
  
  if (linker != 0) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                        in_stack_00000008);
    return (int)(pEVar1->subCat == CAT_POINTER);
  }
  __assert_fail("linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,0xb5,"int NULLCTypeInfo::IsPointerRef(NULLCRef)");
}

Assistant:

int IsPointerRef(NULLCRef r)
	{
		assert(linker);
		return linker->exTypes[r.typeID].subCat == ExternTypeInfo::CAT_POINTER;
	}